

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O3

void CheckGet(leveldb_t *db,leveldb_readoptions_t *options,char *key,char *expected)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t extraout_RAX;
  size_t n;
  size_t n_00;
  char *expected_00;
  leveldb_readoptions_t *expected_01;
  leveldb_iterator_t *iter;
  size_t *n_01;
  char *expected_02;
  size_t val_len;
  char *err;
  size_t sStack_90;
  char *pcStack_88;
  leveldb_t *plStack_80;
  char *pcStack_78;
  leveldb_readoptions_t *plStack_70;
  code *pcStack_68;
  char *pcStack_58;
  leveldb_t *plStack_50;
  char *pcStack_48;
  leveldb_readoptions_t *plStack_40;
  size_t local_38;
  leveldb_iterator_t *local_30;
  
  n_01 = &local_38;
  local_30 = (leveldb_iterator_t *)0x0;
  plStack_40 = (leveldb_readoptions_t *)0x107034;
  pcVar2 = (char *)strlen(key);
  plStack_40 = (leveldb_readoptions_t *)0x10704b;
  expected_01 = options;
  pcVar3 = leveldb_get(db,options,key,(size_t)pcVar2,&local_38,(char **)&local_30);
  if (local_30 == (leveldb_iterator_t *)0x0) {
    plStack_40 = (leveldb_readoptions_t *)0x107066;
    CheckEqual(expected,pcVar3,local_38);
    if (pcVar3 != (char *)0x0) {
      plStack_40 = (leveldb_readoptions_t *)0x107073;
      free(pcVar3);
    }
    return;
  }
  plStack_40 = (leveldb_readoptions_t *)CheckPut;
  iter = local_30;
  CheckGet_cold_1();
  iVar1 = *(int *)&iter->rep;
  pcStack_58 = expected;
  plStack_50 = db;
  pcStack_48 = key;
  plStack_40 = options;
  if (1 < iVar1) {
    pcStack_68 = CheckDel;
    CheckPut_cold_1();
    pcStack_68 = (code *)expected;
    if (*(int *)&iter->rep == 2) {
      plStack_70 = (leveldb_readoptions_t *)0x107100;
      CheckEqual("bar",(char *)expected_01,n_00);
      *(int *)&iter->rep = *(int *)&iter->rep + 1;
      return;
    }
    plStack_70 = (leveldb_readoptions_t *)CheckIter;
    CheckDel_cold_1();
    sStack_90 = extraout_RAX;
    pcStack_88 = expected;
    plStack_80 = db;
    pcStack_78 = key;
    plStack_70 = options;
    pcVar2 = leveldb_iter_key(iter,&sStack_90);
    CheckEqual((char *)expected_01,pcVar2,sStack_90);
    pcVar2 = leveldb_iter_value(iter,&sStack_90);
    CheckEqual(expected_00,pcVar2,sStack_90);
    return;
  }
  if (iVar1 == 0) {
    expected_02 = "b";
    pcVar3 = "bar";
  }
  else {
    if (iVar1 != 1) goto LAB_001070d8;
    expected_02 = "c";
    pcVar3 = "box";
  }
  pcStack_68 = (code *)0x1070ca;
  CheckEqual(pcVar3,(char *)expected_01,n);
  pcStack_68 = (code *)0x1070d8;
  CheckEqual(expected_02,pcVar2,(size_t)n_01);
LAB_001070d8:
  *(int *)&iter->rep = *(int *)&iter->rep + 1;
  return;
}

Assistant:

static void CheckGet(
    leveldb_t* db,
    const leveldb_readoptions_t* options,
    const char* key,
    const char* expected) {
  char* err = NULL;
  size_t val_len;
  char* val;
  val = leveldb_get(db, options, key, strlen(key), &val_len, &err);
  CheckNoError(err);
  CheckEqual(expected, val, val_len);
  Free(&val);
}